

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

void sym_insert(BuildCtx *ctx,int32_t ofs,char *prefix,char *suffix)

{
  int iVar1;
  undefined4 uVar2;
  BuildSym *pBVar3;
  char *pcVar4;
  BuildSym *pBVar5;
  long local_30;
  ptrdiff_t i;
  char *suffix_local;
  char *prefix_local;
  int32_t ofs_local;
  BuildCtx *ctx_local;
  
  iVar1 = ctx->nsym;
  ctx->nsym = iVar1 + 1;
  local_30 = (long)iVar1;
  while ((0 < local_30 && (ofs < ctx->sym[local_30 + -1].ofs))) {
    pBVar3 = ctx->sym + local_30;
    pBVar5 = ctx->sym + local_30 + -1;
    pBVar3->name = pBVar5->name;
    uVar2 = *(undefined4 *)&pBVar5->field_0xc;
    pBVar3->ofs = pBVar5->ofs;
    *(undefined4 *)&pBVar3->field_0xc = uVar2;
    local_30 = local_30 + -1;
  }
  ctx->sym[local_30].ofs = ofs;
  pcVar4 = sym_decorate(ctx,prefix,suffix);
  ctx->sym[local_30].name = pcVar4;
  return;
}

Assistant:

static void sym_insert(BuildCtx *ctx, int32_t ofs,
		       const char *prefix, const char *suffix)
{
  ptrdiff_t i = ctx->nsym++;
  while (i > 0) {
    if (ctx->sym[i-1].ofs <= ofs)
      break;
    ctx->sym[i] = ctx->sym[i-1];
    i--;
  }
  ctx->sym[i].ofs = ofs;
  ctx->sym[i].name = sym_decorate(ctx, prefix, suffix);
}